

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::MakeNamedMedium
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string local_128;
  string local_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  local_128._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_128);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  if (this->upgrade == true) {
    bVar1 = std::operator==(name,"heterogeneous");
    if (bVar1) {
      indent_abi_cxx11_(&local_128,this,0);
      ParameterDictionary::ToParameterList_abi_cxx11_
                (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
      Printf<std::__cxx11::string,char_const(&)[12],std::__cxx11::string>
                ("%sMakeNamedMedium \"%s\"\n%s\n",&local_128,(char (*) [12])"uniformgrid",&local_108
                );
      goto LAB_0028d7bf;
    }
  }
  indent_abi_cxx11_(&local_128,this,0);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string>
            ("%sMakeNamedMedium \"%s\"\n%s\n",&local_128,name,&local_108);
LAB_0028d7bf:
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_e8.params);
  return;
}

Assistant:

void FormattingScene::MakeNamedMedium(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade && name == "heterogeneous")
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), "uniformgrid",
               dict.ToParameterList(catIndentCount));
    else
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), name,
               dict.ToParameterList(catIndentCount));
}